

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O2

Matrix __thiscall maths::Matrix::augment(Matrix *this,Matrix *A,Matrix *B)

{
  double **ppdVar1;
  double **ppdVar2;
  double **ppdVar3;
  double **ppdVar4;
  long lVar5;
  int j;
  double **ppdVar6;
  double *pdVar7;
  Matrix MVar8;
  
  Matrix(this,A->rows_,B->cols_ + A->cols_);
  ppdVar4 = (double **)0x0;
  ppdVar3 = (double **)(ulong)(uint)this->cols_;
  if (this->cols_ < 1) {
    ppdVar3 = ppdVar4;
  }
  ppdVar1 = this->p;
  ppdVar2 = (double **)(ulong)(uint)this->rows_;
  if (this->rows_ < 1) {
    ppdVar2 = ppdVar4;
  }
  for (; ppdVar4 != ppdVar2; ppdVar4 = (double **)((long)ppdVar4 + 1)) {
    lVar5 = 0;
    for (ppdVar6 = (double **)0x0; ppdVar3 != ppdVar6; ppdVar6 = (double **)((long)ppdVar6 + 1)) {
      if ((long)ppdVar6 < (long)A->cols_) {
        pdVar7 = (double *)((long)A->p[(long)ppdVar4] + lVar5);
      }
      else {
        pdVar7 = B->p[(long)ppdVar4] + ((long)(int)ppdVar6 - (long)B->cols_);
      }
      ppdVar1[(long)ppdVar4][(long)ppdVar6] = *pdVar7;
      lVar5 = lVar5 + 8;
    }
  }
  MVar8.p = ppdVar4;
  MVar8._0_8_ = this;
  return MVar8;
}

Assistant:

Matrix Matrix::augment(Matrix A, Matrix B)
{
    Matrix AB(A.rows_, A.cols_ + B.cols_);
    for (int i = 0; i < AB.rows_; ++i) {
        for (int j = 0; j < AB.cols_; ++j) {
            if (j < A.cols_)
                AB(i, j) = A(i, j);
            else
                AB(i, j) = B(i, j - B.cols_);
        }
    }
    return AB;
}